

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O2

Reals __thiscall
Omega_h::get_curv_vert_curvatures_dim<2>
          (Omega_h *this,Mesh *mesh,LOs *curv_edge2edge,Reals *curv_edge_curvatures,
          LOs *curv_vert2vert)

{
  Alloc *pAVar1;
  LO LVar2;
  void *extraout_RDX;
  LO size_in;
  size_t sVar3;
  Reals RVar4;
  Reals curv_vert_curvatures;
  Write<double> curv_vert_curvatures_w;
  Read<signed_char> edges_touch_bdry;
  Write<int> local_1b0;
  Write<double> local_1a0;
  Write<double> local_190;
  Reals coords;
  Write<signed_char> local_170;
  Write<int> local_160;
  Write<signed_char> local_150;
  Read<signed_char> verts_not_curv;
  Write<int> local_130;
  LOs edge2curv_edge;
  LOs edges2verts;
  type f;
  Adj verts2edges;
  
  Mesh::ask_up(&verts2edges,mesh,0,1);
  Mesh::ask_verts_of((Mesh *)&edges2verts,(Int)mesh);
  Write<int>::Write(&local_130,&curv_edge2edge->write_);
  LVar2 = Mesh::nedges(mesh);
  invert_injective_map((Omega_h *)&edge2curv_edge,(LOs *)&local_130,LVar2);
  Write<int>::~Write(&local_130);
  pAVar1 = (curv_vert2vert->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&f,"",(allocator *)&edges_touch_bdry);
  size_in = (LO)(sVar3 >> 2);
  Read<signed_char>::Read((Read<signed_char> *)&local_150,size_in,'\0',(string *)&f);
  Write<int>::Write(&local_160,&curv_vert2vert->write_);
  LVar2 = Mesh::nverts(mesh);
  map_onto<signed_char>
            ((Omega_h *)&verts_not_curv,(Read<signed_char> *)&local_150,(LOs *)&local_160,LVar2,
             '\x01',1);
  Write<int>::~Write(&local_160);
  Write<signed_char>::~Write(&local_150);
  std::__cxx11::string::~string((string *)&f);
  Write<signed_char>::Write(&local_170,&verts_not_curv.write_);
  mark_up((Omega_h *)&edges_touch_bdry,mesh,0,1,(Read<signed_char> *)&local_170);
  Write<signed_char>::~Write(&local_170);
  Mesh::coords((Mesh *)&coords);
  std::__cxx11::string::string((string *)&f,"",(allocator *)&curv_vert_curvatures);
  Write<double>::Write(&curv_vert_curvatures_w,size_in,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<int>::Write((Write<int> *)&f,&curv_vert2vert->write_);
  Adj::Adj(&f.verts2edges,&verts2edges);
  Write<signed_char>::Write(&f.edges_touch_bdry.write_,&edges_touch_bdry.write_);
  Write<int>::Write(&f.edge2curv_edge.write_,&edge2curv_edge.write_);
  Write<int>::Write(&f.edges2verts.write_,&edges2verts.write_);
  Write<double>::Write(&f.coords.write_,&coords.write_);
  Write<double>::Write(&f.curv_edge_curvatures.write_,&curv_edge_curvatures->write_);
  Write<double>::Write(&f.curv_vert_curvatures_w,&curv_vert_curvatures_w);
  parallel_for<Omega_h::get_curv_vert_curvatures_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>)::_lambda(int)_1_>
            (size_in,&f,"get_curv_vert_curvatures");
  Write<double>::Write(&local_190,&curv_vert_curvatures_w);
  Read<double>::Read((Read<signed_char> *)&curv_vert_curvatures,&local_190);
  Write<double>::~Write(&local_190);
  Write<double>::Write(&local_1a0,&curv_vert_curvatures.write_);
  Write<int>::Write(&local_1b0,&curv_vert2vert->write_);
  Mesh::sync_subset_array<double>
            ((Mesh *)this,(Int)mesh,(Read<double> *)0x0,(LOs *)&local_1a0,0.0,(Int)&local_1b0);
  Write<int>::~Write(&local_1b0);
  Write<double>::~Write(&local_1a0);
  Write<double>::~Write(&curv_vert_curvatures.write_);
  get_curv_vert_curvatures_dim<2>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>,Omega_h::Read<int>)
  ::{lambda(int)#1}::~Mesh((_lambda_int__1_ *)&f);
  Write<double>::~Write(&curv_vert_curvatures_w);
  Write<double>::~Write(&coords.write_);
  Write<signed_char>::~Write(&edges_touch_bdry.write_);
  Write<signed_char>::~Write(&verts_not_curv.write_);
  Write<int>::~Write(&edge2curv_edge.write_);
  Write<int>::~Write(&edges2verts.write_);
  Adj::~Adj(&verts2edges);
  RVar4.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar4.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar4.write_.shared_alloc_;
}

Assistant:

Reals get_curv_vert_curvatures_dim(Mesh* mesh, LOs curv_edge2edge,
    Reals curv_edge_curvatures, LOs curv_vert2vert) {
  auto verts2edges = mesh->ask_up(VERT, EDGE);
  auto edges2verts = mesh->ask_verts_of(EDGE);
  auto edge2curv_edge = invert_injective_map(curv_edge2edge, mesh->nedges());
  auto ncurv_verts = curv_vert2vert.size();
  auto verts_not_curv = map_onto(
      Read<I8>(ncurv_verts, I8(0)), curv_vert2vert, mesh->nverts(), I8(1), 1);
  auto edges_touch_bdry = mark_up(mesh, VERT, EDGE, verts_not_curv);
  auto coords = mesh->coords();
  auto curv_vert_curvatures_w = Write<Real>(ncurv_verts);
  auto f = OMEGA_H_LAMBDA(LO curv_vert) {
    auto vert = curv_vert2vert[curv_vert];
    Int nadj_int_edges = 0;
    for (auto ve = verts2edges.a2ab[vert]; ve < verts2edges.a2ab[vert + 1];
         ++ve) {
      auto edge = verts2edges.ab2b[ve];
      nadj_int_edges += !edges_touch_bdry[edge];
    }
    Real ws = 0.0;
    Real curvature = 0.0;
    for (auto ve = verts2edges.a2ab[vert]; ve < verts2edges.a2ab[vert + 1];
         ++ve) {
      auto edge = verts2edges.ab2b[ve];
      auto curv_edge = edge2curv_edge[edge];
      if (curv_edge < 0) continue;
      if (nadj_int_edges && edges_touch_bdry[edge]) continue;
      auto eev2v = gather_verts<2>(edges2verts, edge);
      auto p = gather_vectors<2, dim>(coords, eev2v);
      auto l = norm(p[1] - p[0]);
      auto ec = curv_edge_curvatures[curv_edge];
      curvature += ec * l;
      ws += l;
    }
    curvature /= ws;
    curv_vert_curvatures_w[curv_vert] = curvature;
  };
  parallel_for(ncurv_verts, f, "get_curv_vert_curvatures");
  auto curv_vert_curvatures = Reals(curv_vert_curvatures_w);
  return mesh->sync_subset_array(
      VERT, curv_vert_curvatures, curv_vert2vert, 0.0, 1);
}